

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int archiverInUse(PHYSFS_Archiver *arc,DirHandle *list)

{
  DirHandle *local_28;
  DirHandle *i;
  DirHandle *list_local;
  PHYSFS_Archiver *arc_local;
  
  local_28 = list;
  while( true ) {
    if (local_28 == (DirHandle *)0x0) {
      return 0;
    }
    if (local_28->funcs == arc) break;
    local_28 = local_28->next;
  }
  return 1;
}

Assistant:

static int archiverInUse(const PHYSFS_Archiver *arc, const DirHandle *list)
{
    const DirHandle *i;
    for (i = list; i != NULL; i = i->next)
    {
        if (i->funcs == arc)
            return 1;
    } /* for */

    return 0;  /* not in use */
}